

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

QRect __thiscall QPlainTextEdit::cursorRect(QPlainTextEdit *this)

{
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *this_01;
  QScrollBar *this_02;
  qreal qVar1;
  qreal qVar2;
  qreal qVar3;
  LayoutDirection LVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  QRect QVar15;
  QRectF r;
  QRectF local_58;
  QWidgetTextControl local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  this_01 = this_00->control;
  QWidgetTextControl::textCursor(local_30);
  local_58.w = -NAN;
  local_58.h._0_4_ = 0xffffffff;
  local_58.h._4_4_ = 0xffffffff;
  local_58.xp = -NAN;
  local_58.yp._0_4_ = 0xffffffff;
  local_58.yp._4_4_ = 0xffffffff;
  QWidgetTextControl::cursorRect(&local_58,(QWidgetTextControl *)this_01,(QTextCursor *)local_30);
  dVar9 = 0.0;
  if (0.0 <= local_58.xp) {
    dVar9 = local_58.xp;
  }
  dVar9 = dVar9 - local_58.xp;
  local_58.xp = local_58.xp + dVar9;
  local_58.w = local_58.w - dVar9;
  QTextCursor::~QTextCursor((QTextCursor *)local_30);
  qVar3 = local_58.w;
  uVar8 = local_58.yp._4_4_;
  qVar2 = local_58.xp;
  dVar9 = (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
  dVar12 = (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
  LVar4 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  this_02 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
  if (LVar4 == RightToLeft) {
    iVar5 = QAbstractSlider::maximum(&this_02->super_QAbstractSlider);
    iVar6 = QAbstractSlider::value
                      (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    uVar7 = iVar5 - iVar6;
  }
  else {
    uVar7 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
  }
  qVar1 = QPlainTextEditPrivate::verticalOffset(this_00,this_00->control->topBlock,this_00->topLine)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    dVar10 = (double)((ulong)qVar2 & 0x8000000000000000 | 0x3fe0000000000000) + qVar2;
    dVar11 = 2147483647.0;
    if (dVar10 <= 2147483647.0) {
      dVar11 = dVar10;
    }
    if (dVar11 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    dVar14 = qVar3 + (qVar2 - (double)(int)dVar11) * 0.5;
    dVar14 = (double)((ulong)dVar14 & 0x8000000000000000 | 0x3fe0000000000000) + dVar14;
    dVar10 = 2147483647.0;
    if (dVar14 <= 2147483647.0) {
      dVar10 = dVar14;
    }
    if (dVar10 <= -2147483648.0) {
      dVar10 = -2147483648.0;
    }
    dVar13 = (double)(((ulong)uVar8 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar9;
    dVar14 = 2147483647.0;
    if (dVar13 <= 2147483647.0) {
      dVar14 = dVar13;
    }
    if (dVar14 <= -2147483648.0) {
      dVar14 = -2147483648.0;
    }
    dVar12 = dVar12 + (dVar9 - (double)(int)dVar14) * 0.5;
    dVar12 = (double)((ulong)dVar12 & 0x8000000000000000 | 0x3fe0000000000000) + dVar12;
    dVar9 = 2147483647.0;
    if (dVar12 <= 2147483647.0) {
      dVar9 = dVar12;
    }
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    uVar8 = (uint)(qVar1 + this_00->topLineFracture);
    QVar15.x1.m_i = (int)dVar11 - uVar7;
    QVar15.y1.m_i = (int)dVar14 - uVar8;
    QVar15.y2.m_i = ~uVar8 + (int)dVar14 + (int)dVar9;
    QVar15.x2.m_i = ~uVar7 + (int)dVar11 + (int)dVar10;
    return QVar15;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPlainTextEdit::cursorRect() const
{
    Q_D(const QPlainTextEdit);
    QRect r = d->control->cursorRect().toRect();
    r.translate(-d->horizontalOffset(),-(int)d->verticalOffset());
    return r;
}